

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::
CmpHelperEQFailure<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>,Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>>
          (char *lhs_expression,char *rhs_expression,
          DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
          *lhs,DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
               *rhs)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
  *in_RSI;
  DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
  *in_RDI;
  AssertionResult AVar1;
  bool in_stack_0000003f;
  string *in_stack_00000040;
  string *in_stack_00000048;
  char *in_stack_00000050;
  char *in_stack_00000058;
  string local_68 [32];
  string local_48 [72];
  
  FormatForComparisonFailureMessage<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>,Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>>
            (in_RSI,in_RDI);
  FormatForComparisonFailureMessage<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>,Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>>
            (in_RSI,in_RDI);
  EqFailure(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
            in_stack_0000003f);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = in_RDI;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}